

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

bool Js::BinarySearchForLocale<&unum_getAvailable_70,&unum_countAvailable_70>(char *localeID)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  char *__s2;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  
  iVar3 = unum_countAvailable_70();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar12 = 1;
  iVar9 = iVar3 + -1;
  iVar6 = 0;
  do {
    iVar4 = iVar6;
    iVar10 = iVar9;
    if (iVar10 < iVar4) {
      Output::Trace(IntlPhase,L"%S(): Could not find localeID %S in %d iterations\n",
                    "BinarySearchForLocale",localeID,uVar12);
      break;
    }
    iVar9 = iVar4 + iVar10;
    iVar11 = iVar9 / 2;
    if (iVar9 < -1 || iVar3 <= iVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3ec,"(i >= 0 && i < count)","i >= 0 && i < count");
      if (!bVar2) goto LAB_00b6add3;
      *puVar7 = 0;
    }
    __s2 = (char *)unum_getAvailable_70(iVar11);
    if (1 < iVar9) {
      pcVar8 = (char *)unum_getAvailable_70(iVar11 + -1);
      iVar9 = strcmp(pcVar8,__s2);
      if (-1 < iVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3f1,
                                    "(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true)"
                                    ,
                                    "i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true"
                                   );
        if (!bVar2) goto LAB_00b6add3;
        *puVar7 = 0;
      }
    }
    if (iVar11 < iVar3 + -1) {
      pcVar8 = (char *)unum_getAvailable_70(iVar11 + 1);
      iVar9 = strcmp(pcVar8,__s2);
      if (iVar9 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3f2,
                                    "(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true)"
                                    ,
                                    "i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true"
                                   );
        if (!bVar2) {
LAB_00b6add3:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
    }
    iVar5 = strcmp(localeID,__s2);
    iVar9 = iVar10;
    iVar6 = iVar4;
    if (iVar5 == 0) {
      Output::Trace(IntlPhase,L"%S(): Found localeID %S in %d iterations\n","BinarySearchForLocale",
                    localeID,uVar12);
    }
    else if (iVar5 < 0) {
      iVar9 = iVar11 + -1;
    }
    else {
      iVar6 = iVar11 + 1;
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  } while (iVar5 != 0);
  return iVar4 <= iVar10;
}

Assistant:

static bool BinarySearchForLocale(const char *localeID)
    {
        const int count = CountAvailableLocalesFunc();
        int left = 0;
        int right = count - 1;
        int iterations = 0;
        while (true)
        {
            iterations += 1;
            if (left > right)
            {
                INTL_TRACE("Could not find localeID %S in %d iterations", localeID, iterations);
                return false;
            }

            int i = (left + right) / 2;
            Assert(i >= 0 && i < count);

            const char *cur = GetAvailableLocalesFunc(i);

            // Ensure that this list is actually binary searchable
            Assert(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true);
            Assert(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true);

            int res = strcmp(localeID, cur);
            if (res == 0)
            {
                INTL_TRACE("Found localeID %S in %d iterations", localeID, iterations);
                return true;
            }
            else if (res < 0)
            {
                right = i - 1;
            }
            else
            {
                left = i + 1;
            }
        }
    }